

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void AsyncTest(void)

{
  uint32_t uVar1;
  __int_type _Var2;
  pointer pCVar3;
  ostream *poVar4;
  CAsyncTask *task;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<long,_std::ratio<1L,_1000000L>_> local_40;
  rep local_38;
  rep nUsCount;
  time_point t2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_20;
  uint32_t n;
  time_point t1;
  __single_object pTaskManager;
  uint32_t nTaskPlanCount;
  
  std::make_unique<sftm::CAsyncTaskManager>();
  pCVar3 = std::unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>::
           operator->((unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
                       *)&t1);
  uVar1 = std::thread::hardware_concurrency();
  sftm::CAsyncTaskManager::Start(pCVar3,uVar1);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n\n\nAsync manager started on ");
  pCVar3 = std::unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>::
           operator->((unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
                       *)&t1);
  uVar1 = sftm::CAsyncTaskManager::GetWorkersCount(pCVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  std::operator<<(poVar4," threads\n");
  tStack_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (t2.__d.__r._4_4_ = 0; t2.__d.__r._4_4_ < 100; t2.__d.__r._4_4_ = t2.__d.__r._4_4_ + 1) {
    pCVar3 = std::unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
             ::operator->((unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
                           *)&t1);
    task = (CAsyncTask *)operator_new(8);
    AsyncTest::CTestTask::CTestTask((CTestTask *)task);
    sftm::CAsyncTaskManager::PushTask(pCVar3,task);
  }
  do {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base *)&AsyncTest::nExecutedTasks);
  } while (_Var2 != 100);
  nUsCount = std::chrono::_V2::system_clock::now();
  local_48.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&nUsCount,&stack0xffffffffffffffe0);
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_48);
  local_38 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_40);
  poVar4 = std::operator<<((ostream *)&std::cout,"\tPlanned tasks: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,100);
  poVar4 = std::operator<<(poVar4,"; Execued tasks: ");
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                    ((__atomic_base *)&AsyncTest::nExecutedTasks);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,_Var2);
  std::operator<<(poVar4,";");
  poVar4 = std::operator<<((ostream *)&std::cout,"\n\tExecution time:\t\t");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_38);
  std::operator<<(poVar4,"\tuS");
  pCVar3 = std::unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>::
           operator->((unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
                       *)&t1);
  sftm::CAsyncTaskManager::Stop(pCVar3);
  std::operator<<((ostream *)&std::cout,"\n\tAsync manager stopped\n");
  std::unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>::
  ~unique_ptr((unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_> *)
              &t1);
  return;
}

Assistant:

void AsyncTest() noexcept
{
	constexpr std::uint32_t nTaskPlanCount = 100;

	static std::atomic<uint32_t> nExecutedTasks = { 0 };

	class CTestTask : public sftm::CAsyncTask
	{
	public:
		virtual ~CTestTask() {}

	public:
		void Execute() noexcept override
		{
			++nExecutedTasks;

			delete this;
		}
	};

	auto pTaskManager = std::make_unique<sftm::CAsyncTaskManager>();
	pTaskManager->Start(std::thread::hardware_concurrency());
	std::cout << "\n\n\nAsync manager started on " << pTaskManager->GetWorkersCount() << " threads\n";

	auto t1 = std::chrono::high_resolution_clock::now();

	for(std::uint32_t n = 0; n < nTaskPlanCount; ++n)
	{
		pTaskManager->PushTask(new CTestTask);
	}

	while(nExecutedTasks != nTaskPlanCount){}

	auto t2 = std::chrono::high_resolution_clock::now();
	auto nUsCount = std::chrono::duration_cast<std::chrono::microseconds>(t2 - t1).count();
	std::cout << "	Planned tasks: " << nTaskPlanCount << "; Execued tasks: " << nExecutedTasks << ";";
	std::cout << "\n	Execution time:		" << nUsCount << "	uS";

	pTaskManager->Stop();
	std::cout << "\n	Async manager stopped\n";
}